

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O3

void av1_post_encode_updates(AV1_COMP *cpi,AV1_COMP_DATA *cpi_data)

{
  int *piVar1;
  FIRSTPASS_INFO *firstpass_info;
  undefined4 uVar2;
  undefined4 uVar3;
  byte bVar4;
  int iVar5;
  AV1_PRIMARY *pAVar6;
  FIRSTPASS_STATS *pFVar7;
  FIRSTPASS_STATS *pFVar8;
  RefCntBuffer *pRVar9;
  RefCntBuffer *pRVar10;
  double dVar11;
  RefCntBuffer *pRVar12;
  RefCntBuffer *pRVar13;
  RefCntBuffer *pRVar14;
  RefCntBuffer *pRVar15;
  RefCntBuffer *pRVar16;
  int64_t iVar17;
  uchar uVar18;
  aom_enc_pass aVar19;
  uint uVar20;
  ulong uVar21;
  AV1_PRIMARY *pAVar22;
  long lVar23;
  MV_STATS *pMVar24;
  uint uVar25;
  long lVar26;
  int *piVar27;
  MV_STATS *pMVar28;
  byte bVar29;
  aom_codec_cx_pkt pkt;
  PSNR_STATS psnr;
  aom_codec_cx_pkt local_168;
  undefined1 local_c0 [72];
  size_t sStack_78;
  double local_70;
  double dStack_68;
  double local_60;
  double dStack_58;
  uint64_t local_50;
  uint64_t uStack_48;
  uint64_t local_40;
  uint64_t uStack_38;
  uint32_t local_30 [2];
  uint32_t auStack_28 [2];
  
  bVar29 = 0;
  pAVar6 = cpi->ppi;
  uVar21 = (ulong)cpi->gf_frame_index;
  bVar4 = (pAVar6->gf_group).update_type[uVar21];
  lVar23 = 0x41f04;
  do {
    if (*(char *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar23) != '\0') {
      uVar20 = 1;
      goto LAB_001b79f5;
    }
    lVar23 = lVar23 + 0x24;
  } while (lVar23 != 0x42024);
  uVar20 = 0;
LAB_001b79f5:
  uVar25 = 0;
  if (pAVar6->valid_gm_model_found[bVar4] != 0x7fffffff) {
    uVar25 = pAVar6->valid_gm_model_found[bVar4];
  }
  pAVar6->valid_gm_model_found[bVar4] = uVar25 | uVar20;
  pFVar7 = (cpi->twopass_frame).this_frame;
  if ((pFVar7 != (FIRSTPASS_STATS *)0x0) &&
     (pFVar8 = ((pAVar6->twopass).stats_buf_ctx)->total_left_stats, pFVar8 != (FIRSTPASS_STATS *)0x0
     )) {
    dVar11 = pFVar7->weight;
    pFVar8->frame = pFVar8->frame - pFVar7->frame;
    pFVar8->weight = pFVar8->weight - dVar11;
    dVar11 = pFVar7->frame_avg_wavelet_energy;
    pFVar8->intra_error = pFVar8->intra_error - pFVar7->intra_error;
    pFVar8->frame_avg_wavelet_energy = pFVar8->frame_avg_wavelet_energy - dVar11;
    dVar11 = pFVar7->sr_coded_error;
    pFVar8->coded_error = pFVar8->coded_error - pFVar7->coded_error;
    pFVar8->sr_coded_error = pFVar8->sr_coded_error - dVar11;
    dVar11 = pFVar7->pcnt_motion;
    pFVar8->pcnt_inter = pFVar8->pcnt_inter - pFVar7->pcnt_inter;
    pFVar8->pcnt_motion = pFVar8->pcnt_motion - dVar11;
    dVar11 = pFVar7->pcnt_neutral;
    pFVar8->pcnt_second_ref = pFVar8->pcnt_second_ref - pFVar7->pcnt_second_ref;
    pFVar8->pcnt_neutral = pFVar8->pcnt_neutral - dVar11;
    dVar11 = pFVar7->inactive_zone_rows;
    pFVar8->intra_skip_pct = pFVar8->intra_skip_pct - pFVar7->intra_skip_pct;
    pFVar8->inactive_zone_rows = pFVar8->inactive_zone_rows - dVar11;
    dVar11 = pFVar7->MVr;
    pFVar8->inactive_zone_cols = pFVar8->inactive_zone_cols - pFVar7->inactive_zone_cols;
    pFVar8->MVr = pFVar8->MVr - dVar11;
    dVar11 = pFVar7->MVc;
    pFVar8->mvr_abs = pFVar8->mvr_abs - pFVar7->mvr_abs;
    pFVar8->MVc = pFVar8->MVc - dVar11;
    dVar11 = pFVar7->MVrv;
    pFVar8->mvc_abs = pFVar8->mvc_abs - pFVar7->mvc_abs;
    pFVar8->MVrv = pFVar8->MVrv - dVar11;
    dVar11 = pFVar7->mv_in_out_count;
    pFVar8->MVcv = pFVar8->MVcv - pFVar7->MVcv;
    pFVar8->mv_in_out_count = pFVar8->mv_in_out_count - dVar11;
    pFVar8->count = pFVar8->count - pFVar7->count;
    dVar11 = pFVar7->duration;
    pFVar8->new_mv_count = pFVar8->new_mv_count - pFVar7->new_mv_count;
    pFVar8->duration = pFVar8->duration - dVar11;
  }
  aVar19 = (cpi->oxcf).pass;
  if (((aVar19 != AOM_RC_FIRST_PASS) && (cpi->compressor_stage != '\x01')) &&
     (cpi->is_dropped_frame == false)) {
    if ((((pAVar6->gf_group).frame_parallel_level[uVar21] == 2) &&
        ((pAVar6->gf_group).frame_parallel_level[uVar21 - 1] == 1)) &&
       ((pAVar6->gf_group).update_type[uVar21 - 1] == '\x06')) {
      pRVar9 = pAVar6->ref_frame_map_copy[0];
      pRVar10 = pAVar6->ref_frame_map_copy[1];
      pRVar12 = pAVar6->ref_frame_map_copy[2];
      pRVar13 = pAVar6->ref_frame_map_copy[3];
      pRVar14 = pAVar6->ref_frame_map_copy[4];
      pRVar15 = pAVar6->ref_frame_map_copy[5];
      pRVar16 = pAVar6->ref_frame_map_copy[7];
      (cpi->common).ref_frame_map[6] = pAVar6->ref_frame_map_copy[6];
      (cpi->common).ref_frame_map[7] = pRVar16;
      (cpi->common).ref_frame_map[4] = pRVar14;
      (cpi->common).ref_frame_map[5] = pRVar15;
      (cpi->common).ref_frame_map[2] = pRVar12;
      (cpi->common).ref_frame_map[3] = pRVar13;
      (cpi->common).ref_frame_map[0] = pRVar9;
      (cpi->common).ref_frame_map[1] = pRVar10;
    }
    lVar23 = 8;
    if (((aVar19 == AOM_RC_ONE_PASS) && (pAVar6->lap_enabled == 0)) &&
       (((cpi->oxcf).mode == '\x01' &&
        (((((cpi->oxcf).gf_cfg.lag_in_frames == 0 && (pAVar6->number_spatial_layers == 1)) &&
          (pAVar6->number_temporal_layers == 1)) &&
         (((pAVar6->rtc_ref).set_ref_frame_config == 0 &&
          ((((cpi->common).seq_params)->order_hint_info).enable_order_hint == 0)))))))) {
      lVar23 = (ulong)(cpi->rt_reduce_num_ref_buffers == 0) + 7;
    }
    uVar20 = (cpi->common).current_frame.refresh_frame_flags;
    lVar26 = 0;
    do {
      if ((uVar20 >> ((uint)lVar26 & 0x1f) & 1) != 0) {
        pRVar9 = (cpi->common).cur_frame;
        pRVar10 = (cpi->common).ref_frame_map[lVar26];
        if (pRVar10 != (RefCntBuffer *)0x0) {
          pRVar10->ref_count = pRVar10->ref_count + -1;
        }
        (cpi->common).ref_frame_map[lVar26] = pRVar9;
        pRVar9->ref_count = pRVar9->ref_count + 1;
      }
      lVar26 = lVar26 + 1;
    } while (lVar23 != lVar26);
    if (((pAVar6->gf_group).frame_parallel_level[uVar21] == 1) &&
       ((pAVar6->gf_group).update_type[uVar21] == '\x06')) {
      pRVar9 = (cpi->common).ref_frame_map[0];
      pRVar10 = (cpi->common).ref_frame_map[1];
      pRVar12 = (cpi->common).ref_frame_map[2];
      pRVar13 = (cpi->common).ref_frame_map[3];
      pRVar14 = (cpi->common).ref_frame_map[4];
      pRVar15 = (cpi->common).ref_frame_map[5];
      pRVar16 = (cpi->common).ref_frame_map[7];
      pAVar6->ref_frame_map_copy[6] = (cpi->common).ref_frame_map[6];
      pAVar6->ref_frame_map_copy[7] = pRVar16;
      pAVar6->ref_frame_map_copy[4] = pRVar14;
      pAVar6->ref_frame_map_copy[5] = pRVar15;
      pAVar6->ref_frame_map_copy[2] = pRVar12;
      pAVar6->ref_frame_map_copy[3] = pRVar13;
      pAVar6->ref_frame_map_copy[0] = pRVar9;
      pAVar6->ref_frame_map_copy[1] = pRVar10;
    }
    av1_rc_postencode_update(cpi,cpi_data->frame_size);
  }
  if (cpi_data->pop_lookahead == 1) {
    av1_lookahead_pop(cpi->ppi->lookahead,cpi_data->flush,cpi->compressor_stage);
  }
  if ((cpi->common).show_frame != 0) {
    pAVar22 = cpi->ppi;
    iVar17 = cpi_data->ts_frame_end;
    pAVar22->ts_start_last_show_frame = cpi_data->ts_frame_start;
    pAVar22->ts_end_last_show_frame = iVar17;
  }
  aVar19 = (cpi->oxcf).pass;
  if ((pAVar6->level_params).keep_level_stats == 0) {
LAB_001b7d53:
    if (aVar19 == AOM_RC_FIRST_PASS) goto LAB_001b7fb3;
  }
  else {
    if (aVar19 == AOM_RC_FIRST_PASS) goto LAB_001b7fb3;
    if (cpi->compressor_stage != '\x01') {
      if (((cpi->common).current_frame.frame_type == '\0') &&
         ((pAVar6->gf_group).refbuf_state[cpi->gf_frame_index] == '\0')) {
        av1_init_level_info(cpi);
      }
      av1_update_level_info
                (cpi,cpi_data->frame_size,cpi_data->ts_frame_start,cpi_data->ts_frame_end);
      aVar19 = (cpi->oxcf).pass;
      goto LAB_001b7d53;
    }
  }
  if (cpi->compressor_stage == '\x01') goto LAB_001b7fb3;
  if ((aVar19 != AOM_RC_ONE_PASS) || (pAVar22 = cpi->ppi, pAVar22->lap_enabled != 0)) {
    av1_twopass_postencode_update(cpi);
    pAVar22 = cpi->ppi;
  }
  uVar21 = (ulong)(uint)(pAVar22->gf_group).layer_depth[cpi->gf_frame_index];
  lVar23 = 7;
  if (uVar21 < 8) {
    lVar23 = *(long *)(&DAT_004da780 + uVar21 * 8);
  }
  piVar1 = pAVar6->fb_of_context_type;
  bVar4 = (cpi->common).current_frame.frame_type;
  if ((((bVar4 & 0xfd) == 0) || ((cpi->common).features.error_resilient_mode != false)) ||
     ((cpi->ext_flags).use_primary_ref_none == true)) {
    pAVar6->fb_of_context_type[4] = -1;
    pAVar6->fb_of_context_type[5] = -1;
    pAVar6->fb_of_context_type[6] = -1;
    pAVar6->fb_of_context_type[7] = -1;
    *piVar1 = -1;
    pAVar6->fb_of_context_type[1] = -1;
    pAVar6->fb_of_context_type[2] = -1;
    pAVar6->fb_of_context_type[3] = -1;
    piVar27 = (cpi->common).remapped_ref_idx + 3;
    if ((cpi->common).show_frame == 0) {
      piVar27 = (cpi->common).remapped_ref_idx + 6;
    }
    piVar1[lVar23] = *piVar27;
  }
  if ((cpi->common).show_existing_frame == 0) {
    if (bVar4 != 0) goto LAB_001b7e17;
    uVar20 = 0;
LAB_001b7e2f:
    piVar1[lVar23] = uVar20;
  }
  else if ((bVar4 != 0) && ((cpi->common).features.error_resilient_mode != false)) {
LAB_001b7e17:
    uVar20 = 0;
    do {
      if (((uint)(cpi->common).current_frame.refresh_frame_flags >> (uVar20 & 0x1f) & 1) != 0)
      goto LAB_001b7e2f;
      uVar20 = uVar20 + 1;
    } while (uVar20 != 8);
  }
  if ((cpi->common).show_frame == 0) {
LAB_001b7ea0:
    if ((pAVar22->rtc_ref).set_ref_frame_config == 0) {
      if ((((cpi->ext_flags).refresh_frame.update_pending == true) &&
          ((cpi->ext_flags).refresh_frame.alt_ref_frame == false)) &&
         (((cpi->ext_flags).refresh_frame.alt2_ref_frame == false &&
          (((cpi->ext_flags).refresh_frame.bwd_ref_frame == false &&
           ((cpi->ext_flags).refresh_frame.golden_frame == false)))))) {
        uVar20 = (cpi->ext_flags).refresh_frame.last_frame ^ 1;
        goto LAB_001b7eaf;
      }
    }
    else {
      uVar20 = (pAVar22->rtc_ref).non_reference_frame;
LAB_001b7eaf:
      if (uVar20 != 0) goto LAB_001b7eb3;
    }
  }
  else {
    if ((cpi->rc).frames_to_key != 0) {
      firstpass_info = &(pAVar22->twopass).firstpass_info;
      if ((pAVar22->twopass).firstpass_info.past_stats_count < 2) {
        av1_firstpass_info_move_cur_index(firstpass_info);
      }
      else {
        av1_firstpass_info_move_cur_index_and_pop(firstpass_info);
      }
      if ((cpi->svc).spatial_layer_id == (cpi->svc).number_spatial_layers + -1) {
        uVar2 = (cpi->rc).frames_to_key;
        uVar3 = (cpi->rc).frames_since_key;
        (cpi->rc).frames_to_key = uVar2 + -1;
        (cpi->rc).frames_since_key = uVar3 + 1;
        piVar1 = &(cpi->rc).frames_to_fwd_kf;
        *piVar1 = *piVar1 + -1;
        piVar1 = &(cpi->rc).frames_since_scene_change;
        *piVar1 = *piVar1 + 1;
      }
    }
    if ((cpi->common).show_frame == 0) {
      pAVar22 = cpi->ppi;
      goto LAB_001b7ea0;
    }
LAB_001b7eb3:
    iVar5 = (cpi->rc).frames_till_gf_update_due;
    if (0 < iVar5) {
      (cpi->rc).frames_till_gf_update_due = iVar5 + -1;
    }
  }
  if (((((cpi->oxcf).pass == AOM_RC_ONE_PASS) && (cpi->ppi->lap_enabled == 0)) &&
      ((cpi->oxcf).mode == '\x01')) &&
     (((cpi->oxcf).gf_cfg.lag_in_frames == 0 &&
      ((cpi->svc).spatial_layer_id == (cpi->svc).number_spatial_layers + -1)))) {
    uVar18 = cpi->gf_frame_index + '\x01';
    if (uVar18 == 0xfa) {
      uVar18 = '\0';
    }
  }
  else {
    uVar18 = cpi->gf_frame_index + '\x01';
  }
  cpi->gf_frame_index = uVar18;
  if (cpi->do_frame_data_update == false) {
    pAVar22 = cpi->ppi;
  }
  else {
    pAVar22 = cpi->ppi;
    if ((cpi->common).show_existing_frame == 0) {
      pAVar22->filter_level[0] = (cpi->common).lf.backup_filter_level[0];
      pAVar22->filter_level[1] = (cpi->common).lf.backup_filter_level[1];
      iVar5 = (cpi->common).lf.backup_filter_level_v;
      pAVar22->filter_level_u = (cpi->common).lf.backup_filter_level_u;
      pAVar22->filter_level_v = iVar5;
    }
  }
  pMVar24 = &cpi->mv_stats;
  pMVar28 = &pAVar22->mv_stats;
  for (lVar23 = 9; lVar23 != 0; lVar23 = lVar23 + -1) {
    iVar5 = pMVar24->q;
    pMVar28->high_prec = pMVar24->high_prec;
    pMVar28->q = iVar5;
    pMVar24 = (MV_STATS *)((long)pMVar24 + (ulong)bVar29 * -0x10 + 8);
    pMVar28 = (MV_STATS *)((long)pMVar28 + ((ulong)bVar29 * -2 + 1) * 8);
  }
  (pAVar22->mv_stats).valid = (cpi->mv_stats).valid;
LAB_001b7fb3:
  if (((pAVar6->rtc_ref).set_ref_frame_config != 0) && (cpi->is_dropped_frame == false)) {
    av1_svc_update_buffer_slot_refreshed(cpi);
    av1_svc_set_reference_was_previous(cpi);
  }
  if (pAVar6->use_svc != 0) {
    av1_save_layer_context(cpi);
  }
  if (((pAVar6->b_calculate_psnr != 0) && (cpi_data->frame_size != 0)) &&
     (((cpi->common).show_existing_frame != 0 ||
      ((((cpi->oxcf).pass != AOM_RC_FIRST_PASS && (cpi->compressor_stage != '\x01')) &&
       ((cpi->common).show_frame != 0)))))) {
    uVar20 = (cpi->oxcf).input_cfg.input_bit_depth;
    uVar25 = (cpi->td).mb.e_mbd.bd;
    aom_calc_highbd_psnr
              (cpi->source,&((cpi->common).cur_frame)->buf,(PSNR_STATS *)local_c0,uVar25,uVar20);
    local_168.data.frame.buf = (void *)local_c0._64_8_;
    local_168.data.frame.sz = sStack_78;
    local_168.data.frame.pts = local_c0._32_8_;
    local_168.data.frame.duration = local_c0._40_8_;
    local_168.data.psnr.sse[2] = local_c0._48_8_;
    local_168.data.frame.vis_frame_size = local_c0._56_8_;
    local_168.data.psnr.psnr[2] = (double)local_c0._16_8_;
    local_168.data.psnr.psnr[3] = (double)local_c0._24_8_;
    local_168.data.psnr.psnr[0] = (double)local_c0._0_8_;
    local_168.data.psnr.psnr[1] = (double)local_c0._8_8_;
    if ((uVar20 < uVar25) && ((cpi->source->flags & 8U) != 0)) {
      local_168.data.psnr.samples_hbd[0] = local_30[0];
      local_168.data.psnr.samples_hbd[1] = local_30[1];
      local_168.data.psnr.samples_hbd[2] = auStack_28[0];
      local_168.data.psnr.samples_hbd[3] = auStack_28[1];
      local_168.data.psnr.sse_hbd[0] = local_50;
      local_168.data.psnr.sse_hbd[1] = uStack_48;
      local_168.data.psnr.sse_hbd[2] = local_40;
      local_168.data.psnr.sse_hbd[3] = uStack_38;
      local_168.data.psnr.psnr_hbd[0] = local_70;
      local_168.data.psnr.psnr_hbd[1] = dStack_68;
      local_168.data.psnr.psnr_hbd[2] = local_60;
      local_168.data.psnr.psnr_hbd[3] = dStack_58;
    }
    local_168.kind = AOM_CODEC_PSNR_PKT;
    aom_codec_pkt_list_add(cpi->ppi->output_pkt_list,&local_168);
  }
  return;
}

Assistant:

void av1_post_encode_updates(AV1_COMP *const cpi,
                             const AV1_COMP_DATA *const cpi_data) {
  AV1_PRIMARY *const ppi = cpi->ppi;
  AV1_COMMON *const cm = &cpi->common;

  update_gm_stats(cpi);

#if !CONFIG_REALTIME_ONLY
  // Update the total stats remaining structure.
  if (cpi->twopass_frame.this_frame != NULL &&
      ppi->twopass.stats_buf_ctx->total_left_stats) {
    subtract_stats(ppi->twopass.stats_buf_ctx->total_left_stats,
                   cpi->twopass_frame.this_frame);
  }
#endif

#if CONFIG_OUTPUT_FRAME_SIZE
  FILE *f = fopen("frame_sizes.csv", "a");
  fprintf(f, "%d,", 8 * (int)cpi_data->frame_size);
  fprintf(f, "%d\n", cm->quant_params.base_qindex);
  fclose(f);
#endif  // CONFIG_OUTPUT_FRAME_SIZE

  if (!is_stat_generation_stage(cpi) && !cpi->is_dropped_frame) {
    // Before calling refresh_reference_frames(), copy ppi->ref_frame_map_copy
    // to cm->ref_frame_map for frame_parallel_level 2 frame in a parallel
    // encode set of lower layer frames.
    // TODO(Remya): Move ref_frame_map from AV1_COMMON to AV1_PRIMARY to avoid
    // copy.
    if (ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] == 2 &&
        ppi->gf_group.frame_parallel_level[cpi->gf_frame_index - 1] == 1 &&
        ppi->gf_group.update_type[cpi->gf_frame_index - 1] ==
            INTNL_ARF_UPDATE) {
      memcpy(cm->ref_frame_map, ppi->ref_frame_map_copy,
             sizeof(cm->ref_frame_map));
    }
    refresh_reference_frames(cpi);
    // For frame_parallel_level 1 frame in a parallel encode set of lower layer
    // frames, store the updated cm->ref_frame_map in ppi->ref_frame_map_copy.
    if (ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] == 1 &&
        ppi->gf_group.update_type[cpi->gf_frame_index] == INTNL_ARF_UPDATE) {
      memcpy(ppi->ref_frame_map_copy, cm->ref_frame_map,
             sizeof(cm->ref_frame_map));
    }
    av1_rc_postencode_update(cpi, cpi_data->frame_size);
  }

  if (cpi_data->pop_lookahead == 1) {
    av1_lookahead_pop(cpi->ppi->lookahead, cpi_data->flush,
                      cpi->compressor_stage);
  }
  if (cpi->common.show_frame) {
    cpi->ppi->ts_start_last_show_frame = cpi_data->ts_frame_start;
    cpi->ppi->ts_end_last_show_frame = cpi_data->ts_frame_end;
  }
  if (ppi->level_params.keep_level_stats && !is_stat_generation_stage(cpi)) {
    // Initialize level info. at the beginning of each sequence.
    if (cm->current_frame.frame_type == KEY_FRAME &&
        ppi->gf_group.refbuf_state[cpi->gf_frame_index] == REFBUF_RESET) {
      av1_init_level_info(cpi);
    }
    av1_update_level_info(cpi, cpi_data->frame_size, cpi_data->ts_frame_start,
                          cpi_data->ts_frame_end);
  }

  if (!is_stat_generation_stage(cpi)) {
#if !CONFIG_REALTIME_ONLY
    if (!has_no_stats_stage(cpi)) av1_twopass_postencode_update(cpi);
#endif
    update_fb_of_context_type(cpi, ppi->fb_of_context_type);
    update_rc_counts(cpi);
    update_end_of_frame_stats(cpi);
  }

#if CONFIG_THREE_PASS
  if (cpi->oxcf.pass == AOM_RC_THIRD_PASS && cpi->third_pass_ctx) {
    av1_pop_third_pass_info(cpi->third_pass_ctx);
  }
#endif

  if (ppi->rtc_ref.set_ref_frame_config && !cpi->is_dropped_frame) {
    av1_svc_update_buffer_slot_refreshed(cpi);
    av1_svc_set_reference_was_previous(cpi);
  }

  if (ppi->use_svc) av1_save_layer_context(cpi);

  // Note *size = 0 indicates a dropped frame for which psnr is not calculated
  if (ppi->b_calculate_psnr && cpi_data->frame_size > 0) {
    if (cm->show_existing_frame ||
        (!is_stat_generation_stage(cpi) && cm->show_frame)) {
      generate_psnr_packet(cpi);
    }
  }

#if CONFIG_INTERNAL_STATS
  if (!is_stat_generation_stage(cpi)) {
    compute_internal_stats(cpi, (int)cpi_data->frame_size);
  }
#endif  // CONFIG_INTERNAL_STATS

#if CONFIG_THREE_PASS
  // Write frame info. Subtract 1 from frame index since if was incremented in
  // update_rc_counts.
  av1_write_second_pass_per_frame_info(cpi, cpi->gf_frame_index - 1);
#endif
}